

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

void js_std_init_handlers(JSRuntime *rt)

{
  undefined8 *opaque;
  undefined4 *puVar1;
  long in_RSI;
  JSSharedArrayBufferFunctions sf;
  JSSharedArrayBufferFunctions local_28;
  
  opaque = (undefined8 *)malloc(0x58);
  if (opaque == (undefined8 *)0x0) {
    js_std_init_handlers_cold_1();
    puVar1 = (undefined4 *)malloc(in_RSI + 8);
    if (puVar1 != (undefined4 *)0x0) {
      *puVar1 = 1;
    }
    return;
  }
  *opaque = 0;
  opaque[1] = 0;
  opaque[2] = 0;
  opaque[3] = 0;
  opaque[4] = 0;
  opaque[5] = 0;
  opaque[6] = 0;
  opaque[7] = 0;
  opaque[8] = 0;
  opaque[9] = 0;
  opaque[10] = 0;
  *opaque = opaque;
  opaque[1] = opaque;
  opaque[2] = opaque + 2;
  opaque[3] = opaque + 2;
  opaque[4] = opaque + 4;
  opaque[5] = opaque + 4;
  opaque[6] = opaque + 6;
  opaque[7] = opaque + 6;
  JS_SetRuntimeOpaque(rt,opaque);
  local_28.sab_opaque = (void *)0x0;
  local_28.sab_alloc = js_sab_alloc;
  local_28.sab_free = js_sab_free;
  local_28.sab_dup = js_sab_dup;
  JS_SetSharedArrayBufferFunctions(rt,&local_28);
  return;
}

Assistant:

void js_std_init_handlers(JSRuntime *rt)
{
    JSThreadState *ts;

    ts = malloc(sizeof(*ts));
    if (!ts) {
        fprintf(stderr, "Could not allocate memory for the worker");
        exit(1);
    }
    memset(ts, 0, sizeof(*ts));
    init_list_head(&ts->os_rw_handlers);
    init_list_head(&ts->os_signal_handlers);
    init_list_head(&ts->os_timers);
    init_list_head(&ts->port_list);

    JS_SetRuntimeOpaque(rt, ts);

#ifdef USE_WORKER
    /* set the SharedArrayBuffer memory handlers */
    {
        JSSharedArrayBufferFunctions sf;
        memset(&sf, 0, sizeof(sf));
        sf.sab_alloc = js_sab_alloc;
        sf.sab_free = js_sab_free;
        sf.sab_dup = js_sab_dup;
        JS_SetSharedArrayBufferFunctions(rt, &sf);
    }
#endif
}